

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_ptr.hpp
# Opt level: O2

Ptr<Catch::CumulativeReporterBase::SectionNode> * __thiscall
Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>::operator=
          (Ptr<Catch::CumulativeReporterBase::SectionNode> *this,
          Ptr<Catch::CumulativeReporterBase::SectionNode> *other)

{
  SectionNode *pSVar1;
  Ptr<Catch::CumulativeReporterBase::SectionNode> local_20;
  
  pSVar1 = other->m_p;
  if (pSVar1 != (SectionNode *)0x0) {
    (*(pSVar1->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable._vptr_NonCopyable
      [2])(pSVar1);
  }
  local_20 = (Ptr<Catch::CumulativeReporterBase::SectionNode>)this->m_p;
  this->m_p = pSVar1;
  ~Ptr(&local_20);
  return this;
}

Assistant:

Ptr& operator = ( Ptr const& other ){
            Ptr temp( other );
            swap( temp );
            return *this;
        }